

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc_global.h
# Opt level: O0

void Abc_PrintInt(int i)

{
  double dVar1;
  double dVar2;
  double v6;
  double v3;
  int i_local;
  
  dVar1 = (double)i / 1000.0;
  dVar2 = (double)i / 1000000.0;
  Abc_Print(1,"  ");
  if ((i < -999) || (999 < i)) {
    if ((dVar1 <= -9.995) || (9.995 <= dVar1)) {
      if ((dVar1 <= -99.95) || (99.95 <= dVar1)) {
        if ((dVar1 <= -999.5) || (999.5 <= dVar1)) {
          if ((dVar2 <= -9.995) || (9.995 <= dVar2)) {
            if ((dVar2 <= -99.95) || (99.95 <= dVar2)) {
              if ((-999.5 < dVar2) && (dVar2 < 999.5)) {
                Abc_Print(1,"%4.0fm",dVar2);
              }
            }
            else {
              Abc_Print(1,"%4.1fm",dVar2);
            }
          }
          else {
            Abc_Print(1,"%4.2fm",dVar2);
          }
        }
        else {
          Abc_Print(1,"%4.0fk",dVar1);
        }
      }
      else {
        Abc_Print(1,"%4.1fk",dVar1);
      }
    }
    else {
      Abc_Print(1,"%4.2fk",dVar1);
    }
  }
  else {
    Abc_Print(1," %4d",(ulong)(uint)i);
  }
  return;
}

Assistant:

static inline void Abc_PrintInt( int i )
{
    double v3 = (double)i/1000;
    double v6 = (double)i/1000000;

    Abc_Print( 1,  "  " );

    if ( i > -1000 && i < 1000 )
        Abc_Print( 1, " %4d", i );

    else if ( v3 > -9.995 && v3 < 9.995 )
        Abc_Print( 1, "%4.2fk", v3 );
    else if ( v3 > -99.95 && v3 < 99.95 )
        Abc_Print( 1, "%4.1fk", v3 );
    else if ( v3 > -999.5 && v3 < 999.5 )
        Abc_Print( 1, "%4.0fk", v3 );

    else if ( v6 > -9.995 && v6 < 9.995 )
        Abc_Print( 1, "%4.2fm", v6 );
    else if ( v6 > -99.95 && v6 < 99.95 )
        Abc_Print( 1, "%4.1fm", v6 );
    else if ( v6 > -999.5 && v6 < 999.5 )
        Abc_Print( 1, "%4.0fm", v6 );
}